

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_telemetry_messenger.c
# Opt level: O1

int telemetry_messenger_send_message_disposition
              (TELEMETRY_MESSENGER_HANDLE messenger_handle,
              TELEMETRY_MESSENGER_MESSAGE_DISPOSITION_INFO *disposition_info,
              TELEMETRY_MESSENGER_DISPOSITION_RESULT disposition_result)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  AMQP_VALUE delivery_state;
  int iVar3;
  char *pcVar4;
  TELEMETRY_MESSENGER_HANDLE pTVar5;
  
  if (messenger_handle == (TELEMETRY_MESSENGER_HANDLE)0x0 ||
      disposition_info == (TELEMETRY_MESSENGER_MESSAGE_DISPOSITION_INFO *)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x5cc;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x5cc;
    }
    pcVar4 = 
    "Failed sending message disposition (either messenger_handle (%p) or disposition_info (%p) are NULL)"
    ;
    iVar3 = 0x5cb;
    pTVar5 = messenger_handle;
LAB_00135143:
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
              ,"telemetry_messenger_send_message_disposition",iVar3,1,pcVar4,pTVar5);
  }
  else {
    if (disposition_info->source == (char *)0x0) {
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0x5d1;
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return 0x5d1;
      }
      pcVar4 = "Failed sending message disposition (disposition_info->source is NULL)";
      iVar3 = 0x5d0;
    }
    else {
      if (messenger_handle->message_receiver != (MESSAGE_RECEIVER_HANDLE)0x0) {
        pTVar5 = (TELEMETRY_MESSENGER_HANDLE)(ulong)disposition_result;
        delivery_state = create_uamqp_disposition_result_from(disposition_result);
        if (delivery_state != (AMQP_VALUE)0x0) {
          iVar1 = messagereceiver_send_message_disposition
                            (messenger_handle->message_receiver,disposition_info->source,
                             disposition_info->message_id,delivery_state);
          if (iVar1 == 0) {
            iVar1 = 0;
          }
          else {
            p_Var2 = xlogging_get_log_function();
            iVar1 = 0x5ea;
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
                        ,"telemetry_messenger_send_message_disposition",0x5e9,1,
                        "Failed sending message disposition (messagereceiver_send_message_disposition failed)"
                       );
            }
          }
          amqpvalue_destroy(delivery_state);
          return iVar1;
        }
        p_Var2 = xlogging_get_log_function();
        iVar1 = 0x5e3;
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return 0x5e3;
        }
        pcVar4 = "Failed sending message disposition (disposition result %d is not supported)";
        iVar3 = 0x5e2;
        goto LAB_00135143;
      }
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0x5da;
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return 0x5da;
      }
      pcVar4 = 
      "Failed sending message disposition (message_receiver is not created; check if it is subscribed)"
      ;
      iVar3 = 0x5d9;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
              ,"telemetry_messenger_send_message_disposition",iVar3,1,pcVar4);
  }
  return iVar1;
}

Assistant:

int telemetry_messenger_send_message_disposition(TELEMETRY_MESSENGER_HANDLE messenger_handle, TELEMETRY_MESSENGER_MESSAGE_DISPOSITION_INFO* disposition_info, TELEMETRY_MESSENGER_DISPOSITION_RESULT disposition_result)
{
    int result;

    if (messenger_handle == NULL || disposition_info == NULL)
    {
        LogError("Failed sending message disposition (either messenger_handle (%p) or disposition_info (%p) are NULL)", messenger_handle, disposition_info);
        result = MU_FAILURE;
    }
    else if (disposition_info->source == NULL)
    {
        LogError("Failed sending message disposition (disposition_info->source is NULL)");
        result = MU_FAILURE;
    }
    else
    {
        TELEMETRY_MESSENGER_INSTANCE* messenger = (TELEMETRY_MESSENGER_INSTANCE*)messenger_handle;

        if (messenger->message_receiver == NULL)
        {
            LogError("Failed sending message disposition (message_receiver is not created; check if it is subscribed)");
            result = MU_FAILURE;
        }
        else
        {
            AMQP_VALUE uamqp_disposition_result;

            if ((uamqp_disposition_result = create_uamqp_disposition_result_from(disposition_result)) == NULL)
            {
                LogError("Failed sending message disposition (disposition result %d is not supported)", disposition_result);
                result = MU_FAILURE;
            }
            else
            {
                if (messagereceiver_send_message_disposition(messenger->message_receiver, disposition_info->source, disposition_info->message_id, uamqp_disposition_result) != RESULT_OK)
                {
                    LogError("Failed sending message disposition (messagereceiver_send_message_disposition failed)");
                    result = MU_FAILURE;
                }
                else
                {
                    result = RESULT_OK;
                }

                amqpvalue_destroy(uamqp_disposition_result);
            }
        }
    }

    return result;
}